

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRItemFactory.h
# Opt level: O2

VRGraphicsToolkit * __thiscall
MinVR::VRItemFactory::createItem<MinVR::VRGraphicsToolkit>
          (VRItemFactory *this,VRMainInterface *vrMain,VRDataIndex *config,string *dataContainer)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->_vptr_VRItemFactory[2])();
  bVar1 = std::type_info::operator==
                    ((type_info *)CONCAT44(extraout_var,iVar2),
                     (type_info *)&VRGraphicsToolkit::typeinfo);
  if (bVar1) {
    iVar2 = (*this->_vptr_VRItemFactory[3])(this,vrMain,config,dataContainer);
    return (VRGraphicsToolkit *)CONCAT44(extraout_var_00,iVar2);
  }
  return (VRGraphicsToolkit *)0x0;
}

Assistant:

T* createItem(VRMainInterface *vrMain, VRDataIndex *config, const std::string &dataContainer) {

    if (getType() == typeid(T)) {

      VRSpecificItemFactory<T>* factory = static_cast<VRSpecificItemFactory<T>*>(this);
			if(factory) {

				return factory->create(vrMain, config, dataContainer);
			}
		}

		return NULL;
	}